

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O3

void nestl::test::detail::
     print_tuple<char_const(&)[38],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
               (ostream *ostream,char (*args) [38],unsigned_long *args_1,char (*args_2) [16],
               unsigned_long *args_3,char (*args_4) [10])

{
  char (*local_28) [10];
  unsigned_long local_20;
  char (*local_18) [16];
  unsigned_long local_10;
  char (*local_8) [38];
  
  local_20 = *args_3;
  local_10 = *args_1;
  local_28 = args_4;
  local_18 = args_2;
  local_8 = args;
  print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,unsigned_long,char_const*,unsigned_long,char_const*>,0ul,1ul,2ul,3ul,4ul>
            (ostream,&local_28);
  return;
}

Assistant:

void print_tuple(std::ostream& ostream, Args&&... args)
{
    print_tuple_impl(ostream, std::make_tuple(args...), gen_seq<sizeof...(Args)>());
}